

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O0

int lws_role_call_alpn_negotiated(lws *wsi,char *alpn)

{
  char *pcVar1;
  int iVar2;
  lws_log_cx *cx;
  char **ppcVar3;
  lws_role_ops *ar;
  lws_role_ops **ppxx;
  char *alpn_local;
  lws *wsi_local;
  
  if (alpn == (char *)0x0) {
    wsi_local._4_4_ = 0;
  }
  else {
    cx = lwsl_wsi_get_cx(wsi);
    _lws_log_cx(cx,lws_log_prepend_wsi,wsi,8,"lws_role_call_alpn_negotiated","\'%s\'",alpn);
    ar = (lws_role_ops *)available_roles;
    do {
      if (ar->name == (char *)0x0) {
        return 0;
      }
      ppcVar3 = &ar->alpn;
      pcVar1 = ar->name;
      ar = (lws_role_ops *)ppcVar3;
    } while (((*(long *)(pcVar1 + 8) == 0) ||
             (iVar2 = strcmp(*(char **)(pcVar1 + 8),alpn), iVar2 != 0)) ||
            ((int)(uint)(byte)pcVar1[0x1e] >> 4 == 0));
    wsi_local._4_4_ =
         (**(code **)(*(long *)(pcVar1 + 0x10) +
                     (long)(((int)(uint)(byte)pcVar1[0x1e] >> 4) + -1) * 8))(wsi,alpn);
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_role_call_alpn_negotiated(struct lws *wsi, const char *alpn)
{
#if defined(LWS_WITH_TLS)
	if (!alpn)
		return 0;

#if !defined(LWS_ESP_PLATFORM)
	lwsl_wsi_info(wsi, "'%s'", alpn);
#endif

	LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar)
		if (ar->alpn && !strcmp(ar->alpn, alpn) &&
		    lws_rops_fidx(ar, LWS_ROPS_alpn_negotiated)) {
#if defined(LWS_WITH_SERVER)
			lws_metrics_tag_wsi_add(wsi, "upg", ar->name);
#endif
			return (lws_rops_func_fidx(ar, LWS_ROPS_alpn_negotiated)).
						   alpn_negotiated(wsi, alpn);
		}
	LWS_FOR_EVERY_AVAILABLE_ROLE_END;
#endif
	return 0;
}